

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbbt.c
# Opt level: O0

unsigned_long clipping_Xbitblt(DspInterface dsp,DLword *dummy,int x,int y,int w,int h)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int LowerRightY;
  int LowerRightX;
  int temp_y;
  int temp_x;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  DLword *dummy_local;
  DspInterface dsp_local;
  
  iVar1 = (dsp->Visible).x + (dsp->Visible).width + -1;
  iVar2 = (dsp->Visible).y + (dsp->Visible).height + -1;
  iVar3 = x + w + -1;
  iVar4 = y + h + -1;
  if ((((iVar3 < (dsp->Visible).x) || (iVar1 < x)) || (iVar4 < (dsp->Visible).y)) || (iVar2 < y)) {
    dsp_local = (DspInterface)0x0;
  }
  else if (((x < (dsp->Visible).x) || (iVar1 < iVar3)) ||
          ((y < (dsp->Visible).y || (iVar2 < iVar4)))) {
    temp_x = w;
    w_local = x;
    if (x < (dsp->Visible).x) {
      temp_x = w - ((dsp->Visible).x - x);
      w_local = (dsp->Visible).x;
    }
    if (iVar1 < iVar3) {
      temp_x = temp_x - (iVar3 - iVar1);
    }
    temp_y = h;
    h_local = y;
    if (y < (dsp->Visible).y) {
      temp_y = h - ((dsp->Visible).y - y);
      h_local = (dsp->Visible).y;
    }
    if (iVar2 < iVar4) {
      temp_y = temp_y - (iVar4 - iVar2);
    }
    if ((0 < temp_x) && (0 < temp_y)) {
      XPutImage(dsp->display_id,dsp->DisplayWindow,dsp->Copy_GC,&dsp->ScreenBitmap,w_local,h_local,
                w_local - (dsp->Visible).x,h_local - (dsp->Visible).y,temp_x,temp_y);
      XFlush(dsp->display_id);
    }
    dsp_local = (DspInterface)0x1;
  }
  else {
    XPutImage(dsp->display_id,dsp->DisplayWindow,dsp->Copy_GC,&dsp->ScreenBitmap,x,y,
              x - (dsp->Visible).x,y - (dsp->Visible).y,w,h);
    XFlush(dsp->display_id);
    dsp_local = (DspInterface)0x1;
  }
  return (unsigned_long)dsp_local;
}

Assistant:

unsigned long clipping_Xbitblt(DspInterface dsp, DLword *dummy, int x, int y, int w, int h)
{
  int temp_x, temp_y, LowerRightX, LowerRightY;

  LowerRightX = dsp->Visible.x + (int)dsp->Visible.width - 1;
  LowerRightY = dsp->Visible.y + (int)dsp->Visible.height - 1;

  /* display region of interest lower right x, y pixel */
  temp_x = x + w - 1;
  temp_y = y + h - 1;

  /* if the display region of interest is completely outside the visible window */
  if ((temp_x < dsp->Visible.x) || (x > LowerRightX) || (temp_y < dsp->Visible.y) ||
      (y > LowerRightY))
    return (0);

  /* if the display region of interest is completely within the visible window */
  if ((x >= dsp->Visible.x) && (temp_x <= LowerRightX) && (y >= dsp->Visible.y) &&
      (temp_y <= LowerRightY)) {
    XLOCK;
    XPutImage(dsp->display_id, dsp->DisplayWindow, dsp->Copy_GC, &dsp->ScreenBitmap, x, y,
              x - dsp->Visible.x, y - dsp->Visible.y, (unsigned)w, (unsigned)h);
    XFlush(dsp->display_id);
    XUNLOCK(dsp);
    return (1);
  }

  /* clip left to visible window */
  if (x < dsp->Visible.x) {
    w -= dsp->Visible.x - x;
    x = dsp->Visible.x;
  }

  /* clip right to visible window */
  if (temp_x > LowerRightX) w -= temp_x - LowerRightX;

  /* clip top to visible window */
  if (y < dsp->Visible.y) {
    h -= dsp->Visible.y - y;
    y = dsp->Visible.y;
  }

  /* clip bottom to visible window */
  if (temp_y > LowerRightY) h -= temp_y - LowerRightY;

  if ((w > 0) && (h > 0)) {
    XLOCK;
    XPutImage(dsp->display_id, dsp->DisplayWindow, dsp->Copy_GC, &dsp->ScreenBitmap, x, y,
              x - dsp->Visible.x, y - dsp->Visible.y, (unsigned)w, (unsigned)h);
    XFlush(dsp->display_id);
    XUNLOCK(dsp);
  }
  return (1);

}